

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O0

bool LEARNER::ec_is_example_header(example *ec)

{
  size_t sVar1;
  cb_class *pcVar2;
  long in_RDI;
  v_array<CB::cb_class> costs;
  v_array<CB::cb_class> local_30;
  bool local_1;
  
  local_30._begin = *(cb_class **)(in_RDI + 0x6828);
  local_30._end = *(cb_class **)(in_RDI + 0x6830);
  local_30.end_array = *(cb_class **)(in_RDI + 0x6838);
  local_30.erase_count = *(size_t *)(in_RDI + 0x6840);
  sVar1 = v_array<CB::cb_class>::size(&local_30);
  if (sVar1 == 1) {
    pcVar2 = v_array<CB::cb_class>::operator[](&local_30,0);
    if ((pcVar2->probability != -1.0) || (NAN(pcVar2->probability))) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ec_is_example_header(example& ec)
{
  v_array<CB::cb_class> costs = ec.l.cb.costs;
  if (costs.size() != 1)
    return false;
  if (costs[0].probability == -1.f)
    return true;
  return false;
}